

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ConvolutionLayerParams::MergePartialFromCodedStream
          (ConvolutionLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  short extraout_AX_00;
  short sVar5;
  int iVar6;
  uint uVar7;
  uint32 uVar8;
  SamePadding *this_00;
  ulong extraout_RAX;
  ValidPadding *this_01;
  ulong extraout_RAX_00;
  WeightParams *pWVar9;
  ulong extraout_RAX_01;
  uint8 *puVar10;
  ulong extraout_RAX_02;
  RepeatedField<unsigned_long> *pRVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  pair<unsigned_long,_bool> pVar15;
  int local_74;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar13 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar13) < 0x80)) goto LAB_0022f328;
        uVar13 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar14 = (ulong)uVar13 | 0x100000000;
    }
    else {
LAB_0022f328:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar14 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar14 = 0x100000000;
      }
      uVar14 = uVar8 | uVar14;
    }
    uVar13 = (uint)uVar14;
    if ((uVar14 & 0x100000000) == 0) goto LAB_0022ef06;
    uVar7 = (uint)(uVar14 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar14;
    if (uVar7 < 0x32) {
      if (uVar7 < 0x14) {
        if (uVar7 != 1) {
          if (uVar7 == 2) {
            if (cVar12 == '\x10') {
              puVar10 = input->buffer_;
              if ((input->buffer_end_ <= puVar10) || ((long)(char)*puVar10 < 0)) {
                pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
                this->kernelchannels_ = pVar15.first;
                goto LAB_0022f2e1;
              }
              this->kernelchannels_ = (long)(char)*puVar10;
              goto LAB_0022f1ae;
            }
            goto LAB_0022ef06;
          }
          if ((uVar7 != 10) || (cVar12 != 'P')) goto LAB_0022ef06;
          puVar10 = input->buffer_;
          if ((puVar10 < input->buffer_end_) && (-1 < (long)(char)*puVar10)) {
            this->ngroups_ = (long)(char)*puVar10;
            goto LAB_0022f1ae;
          }
          pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->ngroups_ = pVar15.first;
LAB_0022f2e1:
          if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_0022ef34;
          goto LAB_0022f2ea;
        }
        if (cVar12 != '\b') goto LAB_0022ef06;
        puVar10 = input->buffer_;
        if ((input->buffer_end_ <= puVar10) || ((long)(char)*puVar10 < 0)) {
          pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->outputchannels_ = pVar15.first;
          goto LAB_0022f2e1;
        }
        this->outputchannels_ = (long)(char)*puVar10;
LAB_0022f1ae:
        input->buffer_ = puVar10 + 1;
      }
      else {
        if (uVar7 != 0x14) {
          if (uVar7 == 0x1e) {
            if (cVar12 == -0x10) {
              uVar8 = 0xf2;
              pRVar11 = &this->stride_;
              goto LAB_0022f281;
            }
            pRVar11 = &this->stride_;
            if ((uVar13 & 0xff) == 0xf2) goto LAB_0022f1d8;
          }
          else if (uVar7 == 0x28) {
            if (cVar12 == '@') {
              uVar8 = 0x142;
              pRVar11 = &this->dilationfactor_;
              goto LAB_0022f281;
            }
            pRVar11 = &this->dilationfactor_;
            if ((uVar13 & 0xff) == 0x42) goto LAB_0022f1d8;
          }
          goto LAB_0022ef06;
        }
        if (cVar12 == -0x60) {
          uVar8 = 0xa2;
          pRVar11 = &this->kernelsize_;
LAB_0022f281:
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (2,uVar8,input,pRVar11);
        }
        else {
          pRVar11 = &this->kernelsize_;
          if ((uVar13 & 0xff) != 0xa2) goto LAB_0022ef06;
LAB_0022f1d8:
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar11);
        }
LAB_0022ef2c:
        if (bVar4 == false) {
LAB_0022f2ea:
          iVar6 = 6;
          goto LAB_0022ef36;
        }
      }
LAB_0022ef34:
      iVar6 = 0;
    }
    else if (uVar7 < 0x5a) {
      if (uVar7 < 0x33) {
        if (cVar12 == -0x6e) {
          if (this->_oneof_case_[0] != 0x32) {
            clear_ConvolutionPaddingType(this);
            this->_oneof_case_[0] = 0x32;
            this_01 = (ValidPadding *)operator_new(0x20);
            ValidPadding::ValidPadding(this_01);
            (this->ConvolutionPaddingType_).valid_ = this_01;
          }
          MergePartialFromCodedStream();
          uVar14 = extraout_RAX_00;
          goto LAB_0022f226;
        }
      }
      else if (uVar7 == 0x33) {
        if (cVar12 == -0x66) {
          if (this->_oneof_case_[0] != 0x33) {
            clear_ConvolutionPaddingType(this);
            this->_oneof_case_[0] = 0x33;
            this_00 = (SamePadding *)operator_new(0x18);
            SamePadding::SamePadding(this_00);
            (this->ConvolutionPaddingType_).same_ = this_00;
          }
          MergePartialFromCodedStream();
          uVar14 = extraout_RAX;
          goto LAB_0022f226;
        }
      }
      else {
        if (uVar7 == 0x3c) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX_00;
        }
        else {
          if (uVar7 != 0x46) goto LAB_0022ef06;
          MergePartialFromCodedStream();
          sVar5 = extraout_AX;
        }
        if (sVar5 != 0) {
          iVar6 = 6;
          if (sVar5 != 1) goto LAB_0022ef34;
          goto LAB_0022ef36;
        }
      }
LAB_0022ef06:
      iVar6 = 7;
      if ((uVar13 & 7) != 4 && uVar13 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar13);
        goto LAB_0022ef2c;
      }
    }
    else {
      if (uVar7 != 0x5a) {
        if (uVar7 == 0x5b) {
          if (cVar12 == -0x26) {
            if (this->bias_ == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar9);
              this->bias_ = pWVar9;
            }
            MergePartialFromCodedStream();
            uVar14 = extraout_RAX_01;
            goto LAB_0022f226;
          }
        }
        else if (uVar7 == 100) {
          if (cVar12 == ' ') {
            uVar8 = 0x322;
            pRVar11 = &this->outputshape_;
            goto LAB_0022f281;
          }
          pRVar11 = &this->outputshape_;
          if ((uVar13 & 0xff) == 0x22) goto LAB_0022f1d8;
        }
        goto LAB_0022ef06;
      }
      if (cVar12 != -0x2e) goto LAB_0022ef06;
      if (this->weights_ == (WeightParams *)0x0) {
        pWVar9 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(pWVar9);
        this->weights_ = pWVar9;
      }
      MergePartialFromCodedStream();
      uVar14 = extraout_RAX_02;
LAB_0022f226:
      iVar6 = local_74;
      if ((uVar14 & 1) == 0) goto LAB_0022ef34;
    }
LAB_0022ef36:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool ConvolutionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ConvolutionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 outputChannels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 kernelChannels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &kernelchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 nGroups = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &ngroups_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 kernelSize = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_kernelsize())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(160u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 162u, input, this->mutable_kernelsize())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 stride = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_stride())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(240u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 242u, input, this->mutable_stride())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 dilationFactor = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_dilationfactor())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(320u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 322u, input, this->mutable_dilationfactor())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ValidPadding valid = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_valid()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SamePadding same = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_same()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isDeconvolution = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(480u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isdeconvolution_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(560u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 90;
      case 90: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(722u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 91;
      case 91: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(730u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(800u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 802u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ConvolutionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ConvolutionLayerParams)
  return false;
#undef DO_
}